

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::saveModel(FastText *this,string *filename)

{
  byte bVar1;
  bool bVar2;
  invalid_argument *this_00;
  runtime_error *this_01;
  element_type *peVar3;
  element_type *peVar4;
  string *in_RSI;
  long in_RDI;
  ofstream ofs;
  ostream *in_stack_fffffffffffffd98;
  Args *in_stack_fffffffffffffda0;
  char *in_stack_fffffffffffffdc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc8;
  char local_210 [72];
  ostream *in_stack_fffffffffffffe38;
  Dictionary *in_stack_fffffffffffffe40;
  
  std::ofstream::ofstream(local_210,in_RSI,_S_bin);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
    std::invalid_argument::invalid_argument(this_00,(string *)&stack0xfffffffffffffdc0);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x20));
  if ((bVar2) &&
     (bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x30)), bVar2)) {
    signModel((FastText *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1b949e);
    Args::save(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1b94bb);
    Dictionary::save(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    std::ostream::write(local_210,in_RDI + 0x68);
    peVar3 = std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1b94f2);
    (*peVar3->_vptr_Matrix[7])(peVar3,local_210);
    peVar4 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1b950f);
    std::ostream::write(local_210,(long)&peVar4->qout);
    peVar3 = std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1b9538);
    (*peVar3->_vptr_Matrix[7])(peVar3,local_210);
    std::ofstream::close();
    std::ofstream::~ofstream(local_210);
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"Model never trained");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void FastText::saveModel(const std::string& filename) {
  std::ofstream ofs(filename, std::ofstream::binary);
  if (!ofs.is_open()) {
    throw std::invalid_argument(filename + " cannot be opened for saving!");
  }
  if (!input_ || !output_) {
    throw std::runtime_error("Model never trained");
  }
  signModel(ofs);
  args_->save(ofs);
  dict_->save(ofs);

  ofs.write((char*)&(quant_), sizeof(bool));
  input_->save(ofs);

  ofs.write((char*)&(args_->qout), sizeof(bool));
  output_->save(ofs);

  ofs.close();
}